

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepGetEstLocalErrors(void *arkode_mem,N_Vector ele)

{
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeERKStepMem *)0x11429b9);
  if (local_4 == 0) {
    N_VScale((realtype)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (N_Vector)0x11429ec);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ERKStepGetEstLocalErrors(void *arkode_mem, N_Vector ele)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepGetEstLocalErrors",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* copy vector to output */
  N_VScale(ONE, ark_mem->tempv1, ele);

  return(ARK_SUCCESS);
}